

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall
wasm::TypeBuilder::setDescriptor(TypeBuilder *this,size_t i,optional<wasm::HeapType> desc)

{
  bool bVar1;
  size_t sVar2;
  pointer pIVar3;
  reference this_00;
  pointer pHVar4;
  HeapType *pHVar5;
  HeapTypeInfo *local_58;
  HeapTypeInfo *info;
  size_t i_local;
  TypeBuilder *this_local;
  optional<wasm::HeapType> desc_local;
  
  this_local = desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  desc_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  sVar2 = size(this);
  if (sVar2 <= i) {
    __assert_fail("i < size() && \"index out of bounds\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0x927,"void wasm::TypeBuilder::setDescriptor(size_t, std::optional<HeapType>)");
  }
  pIVar3 = std::unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>::
           operator->(&this->impl);
  this_00 = std::
            vector<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
            ::operator[](&pIVar3->entries,i);
  pHVar4 = std::
           unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
           ::get(&this_00->info);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (bVar1) {
    pHVar5 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
    local_58 = anon_unknown_0::getHeapTypeInfo((HeapType)pHVar5->id);
  }
  else {
    local_58 = (HeapTypeInfo *)0x0;
  }
  pHVar4->descriptor = local_58;
  return;
}

Assistant:

void TypeBuilder::setDescriptor(size_t i, std::optional<HeapType> desc) {
  assert(i < size() && "index out of bounds");
  HeapTypeInfo* info = impl->entries[i].info.get();
  info->descriptor = desc ? getHeapTypeInfo(*desc) : nullptr;
}